

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall
HEkk::debugSimplexDualInfeasible(HEkk *this,string *message,bool force_report)

{
  uint uVar1;
  undefined8 uVar2;
  byte in_DL;
  long in_RDI;
  HEkk *in_stack_00000010;
  HighsSimplexInfo *info;
  
  computeSimplexDualInfeasible(in_stack_00000010);
  if ((*(int *)(in_RDI + 0x28f0) != 0) || ((in_DL & 1) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x36f8);
    uVar2 = std::__cxx11::string::c_str();
    printf("Iteration %6d: %s num / max / sum dual infeasibilities is %d / %g / %g\n",
           *(undefined8 *)(in_RDI + 0x28f8),*(undefined8 *)(in_RDI + 0x2900),(ulong)uVar1,uVar2,
           (ulong)*(uint *)(in_RDI + 0x28f0));
  }
  return kOk;
}

Assistant:

HighsDebugStatus HEkk::debugSimplexDualInfeasible(const std::string message,
                                                  const bool force_report) {
  const HighsSimplexInfo& info = this->info_;
  computeSimplexDualInfeasible();
  if (info.num_dual_infeasibilities || force_report)
    printf(
        "Iteration %6d: %s num / max / sum dual infeasibilities is %d / %g / "
        "%g\n",
        (int)iteration_count_, message.c_str(),
        (int)info.num_dual_infeasibilities, info.max_dual_infeasibility,
        info.sum_dual_infeasibilities);
  return HighsDebugStatus::kOk;
}